

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall Wasm::WasmBytecodeGenerator::PrintOpBegin(WasmBytecodeGenerator *this,WasmOp op)

{
  uint uVar1;
  WasmType type;
  uint32 uVar2;
  uint uVar3;
  char16 *pcVar4;
  WasmBinaryReader *pWVar5;
  WasmFunctionInfo *pWVar6;
  ulong uVar7;
  char16_t *pcVar8;
  WasmBlock WVar9;
  anon_class_8_1_8991fb9c local_20;
  anon_class_8_1_8991fb9c PrintSignature;
  
  uVar2 = this->opId;
  if (this->lastOpId == uVar2) {
    Output::Print(L"\r\n");
    uVar2 = this->opId;
  }
  this->opId = uVar2 + 1;
  this->lastOpId = uVar2 + 1;
  uVar1 = (this->m_blockInfos).list.
          super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count - 1;
  if (0 < (int)uVar1) {
    Output::SkipToColumn((ulong)uVar1);
  }
  uVar1 = (uint)op;
  local_20.this = this;
  switch(op) {
  case wbV128Load:
    pcVar8 = L"V128Load";
    goto LAB_00d6b47d;
  case wbV128Load|wbNop:
  case wbV128Load|wbBlock:
  case wbV128Load|wbLoop:
  case wbV128Load|wbIf:
  case wbV128Load|wbElse:
  case wbV128Load|wbIf|wbBlock:
  case wbV128Load|wbIf|wbLoop:
  case 0xfd08:
  case 0xfd09:
  case 0xfd0a:
  case wbV128Const|wbBlock:
  case wbV128And|wbNop:
  case wbV128Bitselect|wbNop:
  case wbV128Or|wbIf:
  case wbV128Or|wbElse:
  case wbV128Or|wbIf|wbBlock:
  case wbV128Or|wbIf|wbLoop:
  case 0xfd58:
  case 0xfd59:
  case 0xfd5a:
  case wbV128Or|wbEnd:
  case wbV128Or|wbBr:
  case wbV128Or|wbBrIf:
  case wbV128Or|wbBrTable:
  case wbV128Or|wbReturn:
  case wbI4GeU|wbGetLocal:
  case wbI4GeU|wbSetGlobal:
  case wbI4GeU|wbSetGlobal|wbNop:
  case wbI4GeU|wbSetGlobal|wbBlock:
  case wbI4GeU|wbSetGlobal|wbLoop:
  case wbI4GeU|wbI32LoadMem:
  case wbI4GeU|wbI64LoadMem:
  case wbI4GeU|wbF32LoadMem:
  case wbI16AddSaturateU|wbIf:
  case wbI16AddSaturateU|wbElse:
  case wbI16AddSaturateU|wbIf|wbBlock:
  case wbI16AddSaturateU|wbIf|wbLoop:
  case 0xfd78:
  case 0xfd79:
  case 0xfd7a:
  case wbI16AddSaturateU|wbEnd:
  case wbI16AddSaturateU|wbBr:
  case wbI16AddSaturateU|wbBrIf:
  case wbI16AddSaturateU|wbBrTable:
  case wbI16AddSaturateU|wbReturn:
  case wbV128Load|wbI64DivU:
  case wbV128Load|wbI64Or:
  case wbV128Load|wbI64Xor:
  case wbV128Load|wbI64Shl:
  case wbV128Load|wbI64ShrS:
  case wbV128Load|wbI64ShrU:
  case wbV128Load|wbI64Rol:
  case wbV128Load|wbI64Ror:
  case wbI8AddSaturateU|wbIf:
  case wbI8AddSaturateU|wbIf|wbBlock:
  case wbI8AddSaturateU|wbIf|wbLoop:
  case 0xfd98:
  case 0xfd99:
  case 0xfd9a:
  case wbI8AddSaturateU|wbEnd:
  case wbI8AddSaturateU|wbBr:
  case wbI8AddSaturateU|wbBrIf:
  case wbI8AddSaturateU|wbBrTable:
  case wbI8AddSaturateU|wbReturn:
  case wbV128Load|wbF64Add:
  case wbV128Load|wbF64Min:
  case wbV128Load|wbF64Max:
  case wbV128Load|wbF64CopySign:
  case wbV128Load|wbI32Wrap_I64:
  case wbV128Load|wbI32TruncS_F32:
  case wbV128Load|wbI32TruncU_F32:
  case wbV128Load|wbI32TruncS_F64:
  case wbI4Add|wbNop:
  case wbV128Load|wbI64TruncS_F64:
  case wbV128Load|wbF32SConvertI32:
  case wbV128Load|wbF32UConvertI32:
  case wbV128Load|wbF32SConvertI64:
  case wbV128Load|wbF32DemoteF64:
  case wbV128Load|wbF64SConvertI32:
  case wbV128Load|wbF64UConvertI32:
  case wbV128Load|wbF64SConvertI64:
  case wbV128Load|wbF64UConvertI64:
  case wbV128Load|wbF64PromoteF32:
  case wbV128Load|wbI32ReinterpretF32:
  case wbV128Load|wbI64ReinterpretF64:
  case wbV128Load|wbF32ReinterpretI32:
  case wbV128Load|wbF64ReinterpretI64:
  case wbV128Load|wbI32Extend8_s:
  case wbV128Load|wbI64Extend8_s:
  case wbV128Load|wbI64Extend16_s:
  case wbV128Load|wbI64Extend32_s:
  case wbV128Load|wbI64Extend32_s|wbNop:
  case wbV128Load|wbI64Extend32_s|wbBlock:
  case wbV128Load|wbI64Extend32_s|wbLoop:
  case 0xfdc8:
  case 0xfdc9:
  case 0xfdca:
  case wbI2Add|wbNop:
  case wbV128Load|wbI32Extend8_s|wbCall:
  case wbV128Load|wbI32Extend8_s|wbCall|wbBlock:
  case wbV128Load|wbI32Extend8_s|wbCall|wbLoop:
  case wbV128Load|wbI32Extend8_s|wbCall|wbIf:
  case wbV128Load|wbI32Extend8_s|wbCall|wbElse:
  case wbV128Load|wbI32Extend8_s|wbCall|wbIf|wbBlock:
  case wbV128Load|wbI32Extend8_s|wbCall|wbIf|wbLoop:
  case 0xfdd8:
  case 0xfdd9:
  case wbV128Load|wbI32Extend8_s|wbDrop:
  case wbV128Load|wbI32Extend8_s|wbSelect:
  case wbV128Load|wbI32Extend8_s|wbCall|wbBr:
  case wbV128Load|wbI32Extend8_s|wbCall|wbBrIf:
  case wbV128Load|wbI32Extend8_s|wbCall|wbBrTable:
  case wbV128Load|wbI32Extend8_s|wbCall|wbReturn:
  case wbF4Abs|wbBlock:
  case wbF4Min|wbBlock:
  case wbF4Min|wbLoop:
  case wbF2Abs|wbBlock:
  case wbF2Min|wbBlock:
  case wbF2Min|wbLoop:
  case wbI4TruncS|wbIf:
  case wbI4TruncS|wbElse:
  case wbI4TruncS|wbIf|wbBlock:
  case wbI4TruncS|wbIf|wbLoop:
  case 0xfe00:
  case 0xfe01:
  case 0xfe02:
  case 0xfe03:
  case 0xfe04:
  case 0xfe05:
  case 0xfe06:
  case 0xfe07:
  case 0xfe08:
  case 0xfe09:
  case 0xfe0a:
  case 0xfe0b:
  case 0xfe0c:
  case 0xfe0d:
  case 0xfe0e:
  case 0xfe0f:
switchD_00d6a0b0_caseD_fd01:
    if (uVar1 - 0xfe10 < 0x3f) goto switchD_00d6a15a_caseD_28;
    switch(uVar1) {
    case 0xc:
    case 0xd:
      goto switchD_00d6a15a_caseD_c;
    case 0xe:
      goto switchD_00d6a15a_caseD_e;
    case 0xf:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x3f:
    case 0x40:
      goto switchD_00d6a15a_caseD_f;
    case 0x10:
      goto switchD_00d6a15a_caseD_10;
    case 0x11:
      goto switchD_00d6a15a_caseD_11;
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
      goto switchD_00d6a15a_caseD_20;
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
      break;
    case 0x41:
      goto switchD_00d6a15a_caseD_41;
    case 0x42:
      goto switchD_00d6a15a_caseD_42;
    case 0x43:
      goto switchD_00d6a15a_caseD_43;
    case 0x44:
      goto switchD_00d6a15a_caseD_44;
    default:
      if ((op != wbV128Load) && (op != wbV128Store)) goto switchD_00d6a15a_caseD_f;
    }
    goto switchD_00d6a15a_caseD_28;
  case wbV128Store:
    pcVar8 = L"V128Store";
    goto LAB_00d6b47d;
  case wbV128Const:
    pcVar8 = L"V128Const";
    break;
  case wbV8X16Shuffle:
    pcVar8 = L"V8X16Shuffle";
    break;
  case wbI16Splat:
    pcVar8 = L"I16Splat";
    break;
  case wbI8Splat:
    pcVar8 = L"I8Splat";
    break;
  case wbI4Splat:
    pcVar8 = L"I4Splat";
    break;
  case wbI2Splat:
    pcVar8 = L"I2Splat";
    break;
  case wbF4Splat:
    pcVar8 = L"F4Splat";
    break;
  case wbF2Splat:
    pcVar8 = L"F2Splat";
    break;
  case wbI16ExtractLaneS:
    pcVar8 = L"I16ExtractLaneS";
    break;
  case wbI16ExtractLaneU:
    pcVar8 = L"I16ExtractLaneU";
    break;
  case wbI16ReplaceLane:
    pcVar8 = L"I16ReplaceLane";
    break;
  case wbI8ExtractLaneS:
    pcVar8 = L"I8ExtractLaneS";
    break;
  case wbI8ExtractLaneU:
    pcVar8 = L"I8ExtractLaneU";
    break;
  case wbI8ReplaceLane:
    pcVar8 = L"I8ReplaceLane";
    break;
  case wbI4ExtractLane:
    pcVar8 = L"I4ExtractLane";
    break;
  case wbI4ReplaceLane:
    pcVar8 = L"I4ReplaceLane";
    break;
  case wbI2ExtractLane:
    pcVar8 = L"I2ExtractLane";
    break;
  case wbI2ReplaceLane:
    pcVar8 = L"I2ReplaceLane";
    break;
  case wbF4ExtractLane:
    pcVar8 = L"F4ExtractLane";
    break;
  case wbF4ReplaceLane:
    pcVar8 = L"F4ReplaceLane";
    break;
  case wbF2ExtractLane:
    pcVar8 = L"F2ExtractLane";
    break;
  case wbF2ReplaceLane:
    pcVar8 = L"F2ReplaceLane";
    break;
  case wbI16Eq:
    pcVar8 = L"I16Eq";
    break;
  case wbI16Ne:
    pcVar8 = L"I16Ne";
    break;
  case wbI16LtS:
    pcVar8 = L"I16LtS";
    break;
  case wbI16LtU:
    pcVar8 = L"I16LtU";
    break;
  case wbI16GtS:
    pcVar8 = L"I16GtS";
    break;
  case wbI16GtU:
    pcVar8 = L"I16GtU";
    break;
  case wbI16LeS:
    pcVar8 = L"I16LeS";
    break;
  case wbI16LeU:
    pcVar8 = L"I16LeU";
    break;
  case wbI16GeS:
    pcVar8 = L"I16GeS";
    break;
  case wbI16GeU:
    pcVar8 = L"I16GeU";
    break;
  case wbI8Eq:
    pcVar8 = L"I8Eq";
    break;
  case wbI8Ne:
    pcVar8 = L"I8Ne";
    break;
  case wbI8LtS:
    pcVar8 = L"I8LtS";
    break;
  case wbI8LtU:
    pcVar8 = L"I8LtU";
    break;
  case wbI8GtS:
    pcVar8 = L"I8GtS";
    break;
  case wbI8GtU:
    pcVar8 = L"I8GtU";
    break;
  case wbI8LeS:
    pcVar8 = L"I8LeS";
    break;
  case wbI8LeU:
    pcVar8 = L"I8LeU";
    break;
  case wbI8GeS:
    pcVar8 = L"I8GeS";
    break;
  case wbI8GeU:
    pcVar8 = L"I8GeU";
    break;
  case wbI4Eq:
    pcVar8 = L"I4Eq";
    break;
  case wbI4Ne:
    pcVar8 = L"I4Ne";
    break;
  case wbI4LtS:
    pcVar8 = L"I4LtS";
    break;
  case wbI4LtU:
    pcVar8 = L"I4LtU";
    break;
  case wbI4GtS:
    pcVar8 = L"I4GtS";
    break;
  case wbI4GtU:
    pcVar8 = L"I4GtU";
    break;
  case wbI4LeS:
    pcVar8 = L"I4LeS";
    break;
  case wbI4LeU:
    pcVar8 = L"I4LeU";
    break;
  case wbI4GeS:
    pcVar8 = L"I4GeS";
    break;
  case wbI4GeU:
    pcVar8 = L"I4GeU";
    break;
  case wbF4Eq:
    pcVar8 = L"F4Eq";
    break;
  case wbF4Ne:
    pcVar8 = L"F4Ne";
    break;
  case wbF4Lt:
    pcVar8 = L"F4Lt";
    break;
  case wbF4Gt:
    pcVar8 = L"F4Gt";
    break;
  case wbF4Le:
    pcVar8 = L"F4Le";
    break;
  case wbF4Ge:
    pcVar8 = L"F4Ge";
    break;
  case wbF2Eq:
    pcVar8 = L"F2Eq";
    break;
  case wbF2Ne:
    pcVar8 = L"F2Ne";
    break;
  case wbF2Lt:
    pcVar8 = L"F2Lt";
    break;
  case wbF2Gt:
    pcVar8 = L"F2Gt";
    break;
  case wbF2Le:
    pcVar8 = L"F2Le";
    break;
  case wbF2Ge:
    pcVar8 = L"F2Ge";
    break;
  case wbV128Not:
    pcVar8 = L"V128Not";
    break;
  case wbV128And:
    pcVar8 = L"V128And";
    break;
  case wbV128Or:
    pcVar8 = L"V128Or";
    break;
  case wbV128Xor:
    pcVar8 = L"V128Xor";
    break;
  case wbV128Bitselect:
    pcVar8 = L"V128Bitselect";
    break;
  case wbI16Neg:
    pcVar8 = L"I16Neg";
    break;
  case wbI16AnyTrue:
    pcVar8 = L"I16AnyTrue";
    break;
  case wbI16AllTrue:
    pcVar8 = L"I16AllTrue";
    break;
  case wbI16Shl:
    pcVar8 = L"I16Shl";
    break;
  case wbI16ShrS:
    pcVar8 = L"I16ShrS";
    break;
  case wbI16ShrU:
    pcVar8 = L"I16ShrU";
    break;
  case wbI16Add:
    pcVar8 = L"I16Add";
    break;
  case wbI16AddSaturateS:
    pcVar8 = L"I16AddSaturateS";
    break;
  case wbI16AddSaturateU:
    pcVar8 = L"I16AddSaturateU";
    break;
  case wbI16Sub:
    pcVar8 = L"I16Sub";
    break;
  case wbI16SubSaturateS:
    pcVar8 = L"I16SubSaturateS";
    break;
  case wbI16SubSaturateU:
    pcVar8 = L"I16SubSaturateU";
    break;
  case wbI8Neg:
    pcVar8 = L"I8Neg";
    break;
  case wbI8AnyTrue:
    pcVar8 = L"I8AnyTrue";
    break;
  case wbI8AllTrue:
    pcVar8 = L"I8AllTrue";
    break;
  case wbI8Shl:
    pcVar8 = L"I8Shl";
    break;
  case wbI8ShrS:
    pcVar8 = L"I8ShrS";
    break;
  case wbI8ShrU:
    pcVar8 = L"I8ShrU";
    break;
  case wbI8Add:
    pcVar8 = L"I8Add";
    break;
  case wbI8AddSaturateS:
    pcVar8 = L"I8AddSaturateS";
    break;
  case wbI8AddSaturateU:
    pcVar8 = L"I8AddSaturateU";
    break;
  case wbI8Sub:
    pcVar8 = L"I8Sub";
    break;
  case wbI8SubSaturateS:
    pcVar8 = L"I8SubSaturateS";
    break;
  case wbI8SubSaturateU:
    pcVar8 = L"I8SubSaturateU";
    break;
  case wbI8Mul:
    pcVar8 = L"I8Mul";
    break;
  case wbI4Neg:
    pcVar8 = L"I4Neg";
    break;
  case wbI4AnyTrue:
    pcVar8 = L"I4AnyTrue";
    break;
  case wbI4AllTrue:
    pcVar8 = L"I4AllTrue";
    break;
  case wbI4Shl:
    pcVar8 = L"I4Shl";
    break;
  case wbI4ShrS:
    pcVar8 = L"I4ShrS";
    break;
  case wbI4ShrU:
    pcVar8 = L"I4ShrU";
    break;
  case wbI4Add:
    pcVar8 = L"I4Add";
    break;
  case wbI4Sub:
    pcVar8 = L"I4Sub";
    break;
  case wbI4Mul:
    pcVar8 = L"I4Mul";
    break;
  case wbI2Neg:
    pcVar8 = L"I2Neg";
    break;
  case wbI2Shl:
    pcVar8 = L"I2Shl";
    break;
  case wbI2ShrS:
    pcVar8 = L"I2ShrS";
    break;
  case wbI2ShrU:
    pcVar8 = L"I2ShrU";
    break;
  case wbI2Add:
    pcVar8 = L"I2Add";
    break;
  case wbI2Sub:
    pcVar8 = L"I2Sub";
    break;
  case wbF4Abs:
    pcVar8 = L"F4Abs";
    break;
  case wbF4Neg:
    pcVar8 = L"F4Neg";
    break;
  case wbF4Sqrt:
    pcVar8 = L"F4Sqrt";
    break;
  case wbF4Add:
    pcVar8 = L"F4Add";
    break;
  case wbF4Sub:
    pcVar8 = L"F4Sub";
    break;
  case wbF4Mul:
    pcVar8 = L"F4Mul";
    break;
  case wbF4Div:
    pcVar8 = L"F4Div";
    break;
  case wbF4Min:
    pcVar8 = L"F4Min";
    break;
  case wbF4Max:
    pcVar8 = L"F4Max";
    break;
  case wbF2Abs:
    pcVar8 = L"F2Abs";
    break;
  case wbF2Neg:
    pcVar8 = L"F2Neg";
    break;
  case wbF2Sqrt:
    pcVar8 = L"F2Sqrt";
    break;
  case wbF2Add:
    pcVar8 = L"F2Add";
    break;
  case wbF2Sub:
    pcVar8 = L"F2Sub";
    break;
  case wbF2Mul:
    pcVar8 = L"F2Mul";
    break;
  case wbF2Div:
    pcVar8 = L"F2Div";
    break;
  case wbF2Min:
    pcVar8 = L"F2Min";
    break;
  case wbF2Max:
    pcVar8 = L"F2Max";
    break;
  case wbI4TruncS:
    pcVar8 = L"I4TruncS";
    break;
  case wbI4TruncU:
    pcVar8 = L"I4TruncU";
    break;
  case wbF4ConvertS:
    pcVar8 = L"F4ConvertS";
    break;
  case wbF4ConvertU:
    pcVar8 = L"F4ConvertU";
    break;
  case wbI32AtomicLoad:
    pcVar8 = L"I32AtomicLoad";
    goto LAB_00d6b47d;
  case wbI64AtomicLoad:
    pcVar8 = L"I64AtomicLoad";
    goto LAB_00d6b47d;
  case wbI32AtomicLoad8U:
    pcVar8 = L"I32AtomicLoad8U";
    goto LAB_00d6b47d;
  case wbI32AtomicLoad16U:
    pcVar8 = L"I32AtomicLoad16U";
    goto LAB_00d6b47d;
  case wbI64AtomicLoad8U:
    pcVar8 = L"I64AtomicLoad8U";
    goto LAB_00d6b47d;
  case wbI64AtomicLoad16U:
    pcVar8 = L"I64AtomicLoad16U";
    goto LAB_00d6b47d;
  case wbI64AtomicLoad32U:
    pcVar8 = L"I64AtomicLoad32U";
    goto LAB_00d6b47d;
  case wbI32AtomicStore:
    pcVar8 = L"I32AtomicStore";
    goto LAB_00d6b47d;
  case wbI64AtomicStore:
    pcVar8 = L"I64AtomicStore";
    goto LAB_00d6b47d;
  case wbI32AtomicStore8:
    pcVar8 = L"I32AtomicStore8";
    goto LAB_00d6b47d;
  case wbI32AtomicStore16:
    pcVar8 = L"I32AtomicStore16";
    goto LAB_00d6b47d;
  case wbI64AtomicStore8:
    pcVar8 = L"I64AtomicStore8";
    goto LAB_00d6b47d;
  case wbI64AtomicStore16:
    pcVar8 = L"I64AtomicStore16";
    goto LAB_00d6b47d;
  case wbI64AtomicStore32:
    pcVar8 = L"I64AtomicStore32";
    goto LAB_00d6b47d;
  case wbI32AtomicRmwAdd:
    pcVar8 = L"I32AtomicRmwAdd";
    goto LAB_00d6b47d;
  case wbI64AtomicRmwAdd:
    pcVar8 = L"I64AtomicRmwAdd";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw8UAdd:
    pcVar8 = L"I32AtomicRmw8UAdd";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw16UAdd:
    pcVar8 = L"I32AtomicRmw16UAdd";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw8UAdd:
    pcVar8 = L"I64AtomicRmw8UAdd";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw16UAdd:
    pcVar8 = L"I64AtomicRmw16UAdd";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw32UAdd:
    pcVar8 = L"I64AtomicRmw32UAdd";
    goto LAB_00d6b47d;
  case wbI32AtomicRmwSub:
    pcVar8 = L"I32AtomicRmwSub";
    goto LAB_00d6b47d;
  case wbI64AtomicRmwSub:
    pcVar8 = L"I64AtomicRmwSub";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw8USub:
    pcVar8 = L"I32AtomicRmw8USub";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw16USub:
    pcVar8 = L"I32AtomicRmw16USub";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw8USub:
    pcVar8 = L"I64AtomicRmw8USub";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw16USub:
    pcVar8 = L"I64AtomicRmw16USub";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw32USub:
    pcVar8 = L"I64AtomicRmw32USub";
    goto LAB_00d6b47d;
  case wbI32AtomicRmwAnd:
    pcVar8 = L"I32AtomicRmwAnd";
    goto LAB_00d6b47d;
  case wbI64AtomicRmwAnd:
    pcVar8 = L"I64AtomicRmwAnd";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw8UAnd:
    pcVar8 = L"I32AtomicRmw8UAnd";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw16UAnd:
    pcVar8 = L"I32AtomicRmw16UAnd";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw8UAnd:
    pcVar8 = L"I64AtomicRmw8UAnd";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw16UAnd:
    pcVar8 = L"I64AtomicRmw16UAnd";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw32UAnd:
    pcVar8 = L"I64AtomicRmw32UAnd";
    goto LAB_00d6b47d;
  case wbI32AtomicRmwOr:
    pcVar8 = L"I32AtomicRmwOr";
    goto LAB_00d6b47d;
  case wbI64AtomicRmwOr:
    pcVar8 = L"I64AtomicRmwOr";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw8UOr:
    pcVar8 = L"I32AtomicRmw8UOr";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw16UOr:
    pcVar8 = L"I32AtomicRmw16UOr";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw8UOr:
    pcVar8 = L"I64AtomicRmw8UOr";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw16UOr:
    pcVar8 = L"I64AtomicRmw16UOr";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw32UOr:
    pcVar8 = L"I64AtomicRmw32UOr";
    goto LAB_00d6b47d;
  case wbI32AtomicRmwXor:
    pcVar8 = L"I32AtomicRmwXor";
    goto LAB_00d6b47d;
  case wbI64AtomicRmwXor:
    pcVar8 = L"I64AtomicRmwXor";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw8UXor:
    pcVar8 = L"I32AtomicRmw8UXor";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw16UXor:
    pcVar8 = L"I32AtomicRmw16UXor";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw8UXor:
    pcVar8 = L"I64AtomicRmw8UXor";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw16UXor:
    pcVar8 = L"I64AtomicRmw16UXor";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw32UXor:
    pcVar8 = L"I64AtomicRmw32UXor";
    goto LAB_00d6b47d;
  case wbI32AtomicRmwXchg:
    pcVar8 = L"I32AtomicRmwXchg";
    goto LAB_00d6b47d;
  case wbI64AtomicRmwXchg:
    pcVar8 = L"I64AtomicRmwXchg";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw8UXchg:
    pcVar8 = L"I32AtomicRmw8UXchg";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw16UXchg:
    pcVar8 = L"I32AtomicRmw16UXchg";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw8UXchg:
    pcVar8 = L"I64AtomicRmw8UXchg";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw16UXchg:
    pcVar8 = L"I64AtomicRmw16UXchg";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw32UXchg:
    pcVar8 = L"I64AtomicRmw32UXchg";
    goto LAB_00d6b47d;
  case wbI32AtomicRmwCmpxchg:
    pcVar8 = L"I32AtomicRmwCmpxchg";
    goto LAB_00d6b47d;
  case wbI64AtomicRmwCmpxchg:
    pcVar8 = L"I64AtomicRmwCmpxchg";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw8UCmpxchg:
    pcVar8 = L"I32AtomicRmw8UCmpxchg";
    goto LAB_00d6b47d;
  case wbI32AtomicRmw16UCmpxchg:
    pcVar8 = L"I32AtomicRmw16UCmpxchg";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw8UCmpxchg:
    pcVar8 = L"I64AtomicRmw8UCmpxchg";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw16UCmpxchg:
    pcVar8 = L"I64AtomicRmw16UCmpxchg";
    goto LAB_00d6b47d;
  case wbI64AtomicRmw32UCmpxchg:
    pcVar8 = L"I64AtomicRmw32UCmpxchg";
LAB_00d6b47d:
    Output::Print(pcVar8);
switchD_00d6a15a_caseD_28:
    pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    if (pWVar5 == (WasmBinaryReader *)0x0) {
      pWVar5 = (this->m_module->m_reader).ptr;
    }
    (*(code *)(&DAT_0100b9d4 +
              *(int *)(&DAT_0100b9d4 +
                      (ulong)((uint)((pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.
                                     numTargets != 0) +
                             (uint)((pWVar5->super_WasmReaderBase).m_currentNode.field_1.mem.
                                    alignment != '\0') * 2) * 4)))();
    return;
  default:
    switch(op) {
    case wbUnreachable:
      pcVar8 = L"Unreachable";
      break;
    case wbNop:
      pcVar8 = L"Nop";
      break;
    case wbBlock:
      pcVar4 = L"Block";
      goto LAB_00d6b40b;
    case wbLoop:
      pcVar4 = L"Loop";
      goto LAB_00d6b40b;
    case wbIf:
      pcVar4 = L"If";
LAB_00d6b40b:
      Output::Print(pcVar4);
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
        if ((pWVar5->super_WasmReaderBase).m_currentNode.field_1.block.isSingleResult == false)
        goto LAB_00d6b462;
      }
      else if ((pWVar5->super_WasmReaderBase).m_currentNode.field_1.block.isSingleResult != true) {
LAB_00d6b462:
        uVar2 = WasmBlock::GetSignatureId
                          (&(pWVar5->super_WasmReaderBase).m_currentNode.field_1.block);
LAB_00d6b568:
        PrintOpBegin::anon_class_8_1_8991fb9c::operator()(&local_20,uVar2);
        goto switchD_00d6a15a_caseD_f;
      }
      type = WasmBlock::GetSingleResult(&(pWVar5->super_WasmReaderBase).m_currentNode.field_1.block)
      ;
      pcVar4 = WasmTypes::GetTypeName(type);
      Output::Print(L" () -> %s",pcVar4);
      goto switchD_00d6a15a_caseD_f;
    case wbElse:
      pcVar8 = L"Else";
      break;
    case wbIf|wbBlock:
    case wbIf|wbLoop:
    case 8:
    case 9:
    case 10:
    case wbCall|wbBlock:
    case wbCall|wbLoop:
    case wbCall|wbIf:
    case wbCall|wbElse:
    case wbCall|wbIf|wbBlock:
    case wbCall|wbIf|wbLoop:
    case 0x18:
    case 0x19:
    case wbCall|wbBr:
    case wbCall|wbBrIf:
    case wbCall|wbBrTable:
    case wbCall|wbReturn:
    case wbSetGlobal|wbNop:
    case wbSetGlobal|wbBlock:
    case wbSetGlobal|wbLoop:
      goto switchD_00d6a0b0_caseD_fd01;
    case wbEnd:
      pcVar8 = L"End";
      break;
    case wbBr:
      pcVar8 = L"Br";
      goto LAB_00d6aca4;
    case wbBrIf:
      pcVar8 = L"BrIf";
LAB_00d6aca4:
      Output::Print(pcVar8);
switchD_00d6a15a_caseD_c:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar7 = (ulong)(pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      pcVar8 = L" depth: %u";
      goto LAB_00d6b4ff;
    case wbBrTable:
      Output::Print(L"BrTable");
switchD_00d6a15a_caseD_e:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar3 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      uVar1 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.defaultTarget;
      pcVar8 = L" %u cases, default: %u";
      goto LAB_00d6b52c;
    case wbReturn:
      pcVar8 = L"Return";
      break;
    case wbCall:
      Output::Print(L"Call");
switchD_00d6a15a_caseD_10:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar1 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      uVar2 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
      if (uVar1 < uVar2) {
        pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
        if (pWVar5 == (WasmBinaryReader *)0x0) {
          pWVar5 = (this->m_module->m_reader).ptr;
        }
        uVar3 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.call.funcType + Function;
        if (uVar3 < 4) {
          pcVar8 = (char16_t *)(&DAT_0100c50c + *(int *)(&DAT_0100c50c + (ulong)uVar3 * 4));
        }
        else {
          pcVar8 = L" (unknown)";
        }
        Output::Print(pcVar8);
        pWVar6 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,uVar1);
        Js::FunctionBody::DumpFullFunctionName((pWVar6->m_body).ptr);
        goto switchD_00d6a15a_caseD_f;
      }
      pcVar8 = L" invalid id %u";
      uVar7 = (ulong)uVar1;
      goto LAB_00d6b4ff;
    case wbCallIndirect:
      Output::Print(L"CallIndirect");
switchD_00d6a15a_caseD_11:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar2 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      goto LAB_00d6b568;
    case wbDrop:
      pcVar8 = L"Drop";
      break;
    case wbSelect:
      pcVar8 = L"Select";
      break;
    case wbGetLocal:
      pcVar8 = L"GetLocal";
      goto LAB_00d6b579;
    case wbSetLocal:
      pcVar8 = L"SetLocal";
      goto LAB_00d6b579;
    case wbTeeLocal:
      pcVar8 = L"TeeLocal";
      goto LAB_00d6b579;
    case wbGetGlobal:
      pcVar8 = L"GetGlobal";
      goto LAB_00d6b579;
    case wbSetGlobal:
      pcVar8 = L"SetGlobal";
LAB_00d6b579:
      Output::Print(pcVar8);
switchD_00d6a15a_caseD_20:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar7 = (ulong)(pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      pcVar8 = L" (%d)";
LAB_00d6b4ff:
      Output::Print(pcVar8,uVar7);
      goto switchD_00d6a15a_caseD_f;
    case wbI32LoadMem:
      pcVar8 = L"I32LoadMem";
      goto LAB_00d6b47d;
    case wbI64LoadMem:
      pcVar8 = L"I64LoadMem";
      goto LAB_00d6b47d;
    case wbF32LoadMem:
      pcVar8 = L"F32LoadMem";
      goto LAB_00d6b47d;
    case wbF64LoadMem:
      pcVar8 = L"F64LoadMem";
      goto LAB_00d6b47d;
    case wbI32LoadMem8S:
      pcVar8 = L"I32LoadMem8S";
      goto LAB_00d6b47d;
    case wbI32LoadMem8U:
      pcVar8 = L"I32LoadMem8U";
      goto LAB_00d6b47d;
    case wbI32LoadMem16S:
      pcVar8 = L"I32LoadMem16S";
      goto LAB_00d6b47d;
    case wbI32LoadMem16U:
      pcVar8 = L"I32LoadMem16U";
      goto LAB_00d6b47d;
    case wbI64LoadMem8S:
      pcVar8 = L"I64LoadMem8S";
      goto LAB_00d6b47d;
    case wbI64LoadMem8U:
      pcVar8 = L"I64LoadMem8U";
      goto LAB_00d6b47d;
    case wbI64LoadMem16S:
      pcVar8 = L"I64LoadMem16S";
      goto LAB_00d6b47d;
    case wbI64LoadMem16U:
      pcVar8 = L"I64LoadMem16U";
      goto LAB_00d6b47d;
    case wbI64LoadMem32S:
      pcVar8 = L"I64LoadMem32S";
      goto LAB_00d6b47d;
    case wbI64LoadMem32U:
      pcVar8 = L"I64LoadMem32U";
      goto LAB_00d6b47d;
    case wbI32StoreMem:
      pcVar8 = L"I32StoreMem";
      goto LAB_00d6b47d;
    case wbI64StoreMem:
      pcVar8 = L"I64StoreMem";
      goto LAB_00d6b47d;
    case wbF32StoreMem:
      pcVar8 = L"F32StoreMem";
      goto LAB_00d6b47d;
    case wbF64StoreMem:
      pcVar8 = L"F64StoreMem";
      goto LAB_00d6b47d;
    case wbI32StoreMem8:
      pcVar8 = L"I32StoreMem8";
      goto LAB_00d6b47d;
    case wbI32StoreMem16:
      pcVar8 = L"I32StoreMem16";
      goto LAB_00d6b47d;
    case wbI64StoreMem8:
      pcVar8 = L"I64StoreMem8";
      goto LAB_00d6b47d;
    case wbI64StoreMem16:
      pcVar8 = L"I64StoreMem16";
      goto LAB_00d6b47d;
    case wbI64StoreMem32:
      pcVar8 = L"I64StoreMem32";
      goto LAB_00d6b47d;
    case wbMemorySize:
      pcVar8 = L"MemorySize";
      break;
    case wbMemoryGrow:
      pcVar8 = L"MemoryGrow";
      break;
    case wbI32Const:
      Output::Print(L"I32Const");
switchD_00d6a15a_caseD_41:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar1 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      pcVar8 = L" (%d, 0x%x)";
      uVar3 = uVar1;
LAB_00d6b52c:
      Output::Print(pcVar8,(ulong)uVar3,(ulong)uVar1);
      goto switchD_00d6a15a_caseD_f;
    case wbI64Const:
      Output::Print(L"I64Const");
switchD_00d6a15a_caseD_42:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      Output::Print(L" (%lld, 0x%llx)",(pWVar5->super_WasmReaderBase).m_currentNode.field_1.block);
      goto switchD_00d6a15a_caseD_f;
    case wbF32Const:
      Output::Print(L"F32Const");
switchD_00d6a15a_caseD_43:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      WVar9 = (WasmBlock)(double)*(float *)&(pWVar5->super_WasmReaderBase).m_currentNode.field_1;
      goto LAB_00d6b1a5;
    case wbF64Const:
      Output::Print(L"F64Const");
switchD_00d6a15a_caseD_44:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      WVar9 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.block;
LAB_00d6b1a5:
      Output::Print(L" (%.4f)",WVar9);
      goto switchD_00d6a15a_caseD_f;
    case wbI32Eqz:
      pcVar8 = L"I32Eqz";
      break;
    case wbI32Eq:
      pcVar8 = L"I32Eq";
      break;
    case wbI32Ne:
      pcVar8 = L"I32Ne";
      break;
    case wbI32LtS:
      pcVar8 = L"I32LtS";
      break;
    case wbI32LtU:
      pcVar8 = L"I32LtU";
      break;
    case wbI32GtS:
      pcVar8 = L"I32GtS";
      break;
    case wbI32GtU:
      pcVar8 = L"I32GtU";
      break;
    case wbI32LeS:
      pcVar8 = L"I32LeS";
      break;
    case wbI32LeU:
      pcVar8 = L"I32LeU";
      break;
    case wbI32GeS:
      pcVar8 = L"I32GeS";
      break;
    case wbI32GeU:
      pcVar8 = L"I32GeU";
      break;
    case wbI64Eqz:
      pcVar8 = L"I64Eqz";
      break;
    case wbI64Eq:
      pcVar8 = L"I64Eq";
      break;
    case wbI64Ne:
      pcVar8 = L"I64Ne";
      break;
    case wbI64LtS:
      pcVar8 = L"I64LtS";
      break;
    case wbI64LtU:
      pcVar8 = L"I64LtU";
      break;
    case wbI64GtS:
      pcVar8 = L"I64GtS";
      break;
    case wbI64GtU:
      pcVar8 = L"I64GtU";
      break;
    case wbI64LeS:
      pcVar8 = L"I64LeS";
      break;
    case wbI64LeU:
      pcVar8 = L"I64LeU";
      break;
    case wbI64GeS:
      pcVar8 = L"I64GeS";
      break;
    case wbI64GeU:
      pcVar8 = L"I64GeU";
      break;
    case wbF32Eq:
      pcVar8 = L"F32Eq";
      break;
    case wbF32Ne:
      pcVar8 = L"F32Ne";
      break;
    case wbF32Lt:
      pcVar8 = L"F32Lt";
      break;
    case wbF32Gt:
      pcVar8 = L"F32Gt";
      break;
    case wbF32Le:
      pcVar8 = L"F32Le";
      break;
    case wbF32Ge:
      pcVar8 = L"F32Ge";
      break;
    case wbF64Eq:
      pcVar8 = L"F64Eq";
      break;
    case wbF64Ne:
      pcVar8 = L"F64Ne";
      break;
    case wbF64Lt:
      pcVar8 = L"F64Lt";
      break;
    case wbF64Gt:
      pcVar8 = L"F64Gt";
      break;
    case wbF64Le:
      pcVar8 = L"F64Le";
      break;
    case wbF64Ge:
      pcVar8 = L"F64Ge";
      break;
    case wbI32Clz:
      pcVar8 = L"I32Clz";
      break;
    case wbI32Ctz:
      pcVar8 = L"I32Ctz";
      break;
    case wbI32Popcnt:
      pcVar8 = L"I32Popcnt";
      break;
    case wbI32Add:
      pcVar8 = L"I32Add";
      break;
    case wbI32Sub:
      pcVar8 = L"I32Sub";
      break;
    case wbI32Mul:
      pcVar8 = L"I32Mul";
      break;
    case wbI32DivS:
      pcVar8 = L"I32DivS";
      break;
    case wbI32DivU:
      pcVar8 = L"I32DivU";
      break;
    case wbI32RemS:
      pcVar8 = L"I32RemS";
      break;
    case wbI32RemU:
      pcVar8 = L"I32RemU";
      break;
    case wbI32And:
      pcVar8 = L"I32And";
      break;
    case wbI32Or:
      pcVar8 = L"I32Or";
      break;
    case wbI32Xor:
      pcVar8 = L"I32Xor";
      break;
    case wbI32Shl:
      pcVar8 = L"I32Shl";
      break;
    case wbI32ShrS:
      pcVar8 = L"I32ShrS";
      break;
    case wbI32ShrU:
      pcVar8 = L"I32ShrU";
      break;
    case wbI32Rol:
      pcVar8 = L"I32Rol";
      break;
    case wbI32Ror:
      pcVar8 = L"I32Ror";
      break;
    case wbI64Clz:
      pcVar8 = L"I64Clz";
      break;
    case wbI64Ctz:
      pcVar8 = L"I64Ctz";
      break;
    case wbI64Popcnt:
      pcVar8 = L"I64Popcnt";
      break;
    case wbI64Add:
      pcVar8 = L"I64Add";
      break;
    case wbI64Sub:
      pcVar8 = L"I64Sub";
      break;
    case wbI64Mul:
      pcVar8 = L"I64Mul";
      break;
    case wbI64DivS:
      pcVar8 = L"I64DivS";
      break;
    case wbI64DivU:
      pcVar8 = L"I64DivU";
      break;
    case wbI64RemS:
      pcVar8 = L"I64RemS";
      break;
    case wbI64RemU:
      pcVar8 = L"I64RemU";
      break;
    case wbI64And:
      pcVar8 = L"I64And";
      break;
    case wbI64Or:
      pcVar8 = L"I64Or";
      break;
    case wbI64Xor:
      pcVar8 = L"I64Xor";
      break;
    case wbI64Shl:
      pcVar8 = L"I64Shl";
      break;
    case wbI64ShrS:
      pcVar8 = L"I64ShrS";
      break;
    case wbI64ShrU:
      pcVar8 = L"I64ShrU";
      break;
    case wbI64Rol:
      pcVar8 = L"I64Rol";
      break;
    case wbI64Ror:
      pcVar8 = L"I64Ror";
      break;
    case wbF32Abs:
      pcVar8 = L"F32Abs";
      break;
    case wbF32Neg:
      pcVar8 = L"F32Neg";
      break;
    case wbF32Ceil:
      pcVar8 = L"F32Ceil";
      break;
    case wbF32Floor:
      pcVar8 = L"F32Floor";
      break;
    case wbF32Trunc:
      pcVar8 = L"F32Trunc";
      break;
    case wbF32NearestInt:
      pcVar8 = L"F32NearestInt";
      break;
    case wbF32Sqrt:
      pcVar8 = L"F32Sqrt";
      break;
    case wbF32Add:
      pcVar8 = L"F32Add";
      break;
    case wbF32Sub:
      pcVar8 = L"F32Sub";
      break;
    case wbF32Mul:
      pcVar8 = L"F32Mul";
      break;
    case wbF32Div:
      pcVar8 = L"F32Div";
      break;
    case wbF32Min:
      pcVar8 = L"F32Min";
      break;
    case wbF32Max:
      pcVar8 = L"F32Max";
      break;
    case wbF32CopySign:
      pcVar8 = L"F32CopySign";
      break;
    case wbF64Abs:
      pcVar8 = L"F64Abs";
      break;
    case wbF64Neg:
      pcVar8 = L"F64Neg";
      break;
    case wbF64Ceil:
      pcVar8 = L"F64Ceil";
      break;
    case wbF64Floor:
      pcVar8 = L"F64Floor";
      break;
    case wbF64Trunc:
      pcVar8 = L"F64Trunc";
      break;
    case wbF64NearestInt:
      pcVar8 = L"F64NearestInt";
      break;
    case wbF64Sqrt:
      pcVar8 = L"F64Sqrt";
      break;
    case wbF64Add:
      pcVar8 = L"F64Add";
      break;
    case wbF64Sub:
      pcVar8 = L"F64Sub";
      break;
    case wbF64Mul:
      pcVar8 = L"F64Mul";
      break;
    case wbF64Div:
      pcVar8 = L"F64Div";
      break;
    case wbF64Min:
      pcVar8 = L"F64Min";
      break;
    case wbF64Max:
      pcVar8 = L"F64Max";
      break;
    case wbF64CopySign:
      pcVar8 = L"F64CopySign";
      break;
    case wbI32Wrap_I64:
      pcVar8 = L"I32Wrap_I64";
      break;
    case wbI32TruncS_F32:
      pcVar8 = L"I32TruncS_F32";
      break;
    case wbI32TruncU_F32:
      pcVar8 = L"I32TruncU_F32";
      break;
    case wbI32TruncS_F64:
      pcVar8 = L"I32TruncS_F64";
      break;
    case wbI32TruncU_F64:
      pcVar8 = L"I32TruncU_F64";
      break;
    case wbI64ExtendS_I32:
      pcVar8 = L"I64ExtendS_I32";
      break;
    case wbI64ExtendU_I32:
      pcVar8 = L"I64ExtendU_I32";
      break;
    case wbI64TruncS_F32:
      pcVar8 = L"I64TruncS_F32";
      break;
    case wbI64TruncU_F32:
      pcVar8 = L"I64TruncU_F32";
      break;
    case wbI64TruncS_F64:
      pcVar8 = L"I64TruncS_F64";
      break;
    case wbI64TruncU_F64:
      pcVar8 = L"I64TruncU_F64";
      break;
    case wbF32SConvertI32:
      pcVar8 = L"F32SConvertI32";
      break;
    case wbF32UConvertI32:
      pcVar8 = L"F32UConvertI32";
      break;
    case wbF32SConvertI64:
      pcVar8 = L"F32SConvertI64";
      break;
    case wbF32UConvertI64:
      pcVar8 = L"F32UConvertI64";
      break;
    case wbF32DemoteF64:
      pcVar8 = L"F32DemoteF64";
      break;
    case wbF64SConvertI32:
      pcVar8 = L"F64SConvertI32";
      break;
    case wbF64UConvertI32:
      pcVar8 = L"F64UConvertI32";
      break;
    case wbF64SConvertI64:
      pcVar8 = L"F64SConvertI64";
      break;
    case wbF64UConvertI64:
      pcVar8 = L"F64UConvertI64";
      break;
    case wbF64PromoteF32:
      pcVar8 = L"F64PromoteF32";
      break;
    case wbI32ReinterpretF32:
      pcVar8 = L"I32ReinterpretF32";
      break;
    case wbI64ReinterpretF64:
      pcVar8 = L"I64ReinterpretF64";
      break;
    case wbF32ReinterpretI32:
      pcVar8 = L"F32ReinterpretI32";
      break;
    case wbF64ReinterpretI64:
      pcVar8 = L"F64ReinterpretI64";
      break;
    case wbI32Extend8_s:
      pcVar8 = L"I32Extend8_s";
      break;
    case wbI32Extend16_s:
      pcVar8 = L"I32Extend16_s";
      break;
    case wbI64Extend8_s:
      pcVar8 = L"I64Extend8_s";
      break;
    case wbI64Extend16_s:
      pcVar8 = L"I64Extend16_s";
      break;
    case wbI64Extend32_s:
      pcVar8 = L"I64Extend32_s";
      break;
    default:
      switch(uVar1) {
      case 0xf000:
        pcVar8 = L"PrintFuncName";
        break;
      case 0xf001:
        pcVar8 = L"PrintArgSeparator";
        break;
      case 0xf002:
        pcVar8 = L"PrintBeginCall";
        break;
      case 0xf003:
        pcVar8 = L"PrintNewLine";
        break;
      case 0xf004:
        pcVar8 = L"PrintEndCall";
        break;
      case 0xf005:
      case 0xf006:
      case 0xf007:
      case 0xf008:
      case 0xf009:
      case 0xf00a:
      case 0xf00b:
        goto switchD_00d6a0b0_caseD_fd01;
      case 0xf00c:
        pcVar8 = L"PrintI32";
        break;
      case 0xf00d:
        pcVar8 = L"PrintI64";
        break;
      case 0xf00e:
        pcVar8 = L"PrintF32";
        break;
      case 0xf00f:
        pcVar8 = L"PrintF64";
        break;
      default:
        switch(uVar1) {
        case 0xfc00:
          pcVar8 = L"I32SatTruncS_F32";
          break;
        case 0xfc01:
          pcVar8 = L"I32SatTruncU_F32";
          break;
        case 0xfc02:
          pcVar8 = L"I32SatTruncS_F64";
          break;
        case 0xfc03:
          pcVar8 = L"I32SatTruncU_F64";
          break;
        case 0xfc04:
          pcVar8 = L"I64SatTruncS_F32";
          break;
        case 0xfc05:
          pcVar8 = L"I64SatTruncU_F32";
          break;
        case 0xfc06:
          pcVar8 = L"I64SatTruncS_F64";
          break;
        case 0xfc07:
          pcVar8 = L"I64SatTruncU_F64";
          break;
        default:
          goto switchD_00d6a0b0_caseD_fd01;
        }
      }
    }
  }
  Output::Print(pcVar8);
switchD_00d6a15a_caseD_f:
  Output::SkipToColumn(0x28);
  PrintTypeStack(this);
  return;
}

Assistant:

void WasmBytecodeGenerator::PrintOpBegin(WasmOp op)
{
    if (lastOpId == opId) Output::Print(_u("\r\n"));
    lastOpId = ++opId;
    const int depth = m_blockInfos.Count() - 1;
    if (depth > 0)
    {
        Output::SkipToColumn(depth);
    }
    const auto PrintSignature = [this](uint32 sigId)
    {
        if (sigId < m_module->GetSignatureCount())
        {
            Output::Print(_u(" "));
            WasmSignature* sig = m_module->GetSignature(sigId);
            sig->Dump(64);
        }
        else
        {
            Output::Print(_u(" invalid signature id %u"), sigId);
        }
    };

    switch (op)
    {
#define WASM_OPCODE(opname, ...) \
case wb##opname: \
    Output::Print(_u(#opname)); \
    break;
#include "WasmBinaryOpCodes.h"
    }
    switch (op)
    {
    case wbIf:
    case wbLoop:
    case wbBlock: 
        if (GetReader()->m_currentNode.block.IsSingleResult())
        {
            Output::Print(_u(" () -> %s"), GetTypeName(GetReader()->m_currentNode.block.GetSingleResult()));
        }
        else
        {
            PrintSignature(GetReader()->m_currentNode.block.GetSignatureId()); break;
        }
        break;
    case wbBr:
    case wbBrIf: Output::Print(_u(" depth: %u"), GetReader()->m_currentNode.br.depth); break;
    case wbBrTable: Output::Print(_u(" %u cases, default: %u"), GetReader()->m_currentNode.brTable.numTargets, GetReader()->m_currentNode.brTable.defaultTarget); break;
    case wbCallIndirect: PrintSignature(GetReader()->m_currentNode.call.num); break;
    case wbCall:
    {
        uint32 id = GetReader()->m_currentNode.call.num;
        if (id < m_module->GetWasmFunctionCount())
        {
            FunctionIndexTypes::Type funcType = GetReader()->m_currentNode.call.funcType;
            switch (funcType)
            {
            case Wasm::FunctionIndexTypes::Invalid: Output::Print(_u(" (invalid) ")); break;
            case Wasm::FunctionIndexTypes::ImportThunk: Output::Print(_u(" (thunk) ")); break;
            case Wasm::FunctionIndexTypes::Function: Output::Print(_u(" (func) ")); break;
            case Wasm::FunctionIndexTypes::Import: Output::Print(_u(" (import) ")); break;
            default:  Output::Print(_u(" (unknown)")); break;
            }
            auto func = this->m_module->GetWasmFunctionInfo(id);
            func->GetBody()->DumpFullFunctionName();
        }
        else
        {
            Output::Print(_u(" invalid id %u"), id);
        }
        break;
    }
    case wbSetLocal:
    case wbGetLocal:
    case wbTeeLocal:
    case wbGetGlobal:
    case wbSetGlobal: Output::Print(_u(" (%d)"), GetReader()->m_currentNode.var.num); break;
    case wbI32Const: Output::Print(_u(" (%d, 0x%x)"), GetReader()->m_currentNode.cnst.i32, GetReader()->m_currentNode.cnst.i32); break;
    case wbI64Const: Output::Print(_u(" (%lld, 0x%llx)"), GetReader()->m_currentNode.cnst.i64, GetReader()->m_currentNode.cnst.i64); break;
    case wbF32Const: Output::Print(_u(" (%.4f)"), GetReader()->m_currentNode.cnst.f32); break;
    case wbF64Const: Output::Print(_u(" (%.4f)"), GetReader()->m_currentNode.cnst.f64); break;
#define WASM_MEM_OPCODE(opname, ...) case wb##opname: // FallThrough
#include "WasmBinaryOpCodes.h"
    {
        const uint8 alignment = GetReader()->m_currentNode.mem.alignment;
        const uint32 offset = GetReader()->m_currentNode.mem.offset;
        switch (((!!alignment) << 1) | (!!offset))
        {
        case 0: // no alignment, no offset
            Output::Print(_u(" [i]")); break;
        case 1: // no alignment, offset
            Output::Print(_u(" [i + %u (0x%x)]"), offset, offset); break;
        case 2: // alignment, no offset
            Output::Print(_u(" [i & ~0x%x]"), (1 << alignment) - 1); break;
        case 3: // alignment, offset
            Output::Print(_u(" [i + %u (0x%x) & ~0x%x]"), offset, offset, (1 << alignment) - 1); break;
        }
        break;
    }
    }
    Output::SkipToColumn(40);
    PrintTypeStack();
}